

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NFA.hpp
# Opt level: O2

void __thiscall Centaurus::NFA<char>::parse_selection(NFA<char> *this,Stream *stream,wchar_t ch)

{
  fd_set *pfVar1;
  wchar_t ch_00;
  fd_set *__writefds;
  fd_set *__readfds;
  fd_set *in_R8;
  timeval *in_R9;
  NFA<char> nfa;
  NFABase<Centaurus::NFABaseState<char,_int>_> NStack_38;
  
  parse_unit(this,stream,ch);
  while( true ) {
    pfVar1 = (fd_set *)(stream->m_cur)._M_current;
    __writefds = (fd_set *)((stream->m_str)._M_dataplus._M_p + (stream->m_str)._M_string_length);
    if ((pfVar1 == __writefds) || ((int)pfVar1->fds_bits[0] != 0x7c)) break;
    Stream::get(stream);
    NFA((NFA<char> *)&NStack_38);
    ch_00 = Stream::get(stream);
    parse_unit((NFA<char> *)&NStack_38,stream,ch_00);
    select(this,(int)&NStack_38,__readfds,__writefds,in_R8,in_R9);
    NFABase<Centaurus::NFABaseState<char,_int>_>::~NFABase(&NStack_38);
  }
  return;
}

Assistant:

void parse_selection(Stream& stream, wchar_t ch)
    {
        parse_unit(stream, ch);

        while (true)
        {
            ch = stream.peek();

            if (ch != L'|')
            {
                break;
            }

            stream.discard();

            NFA<TCHAR> nfa;
            nfa.parse_unit(stream, stream.get());
            select(nfa);
        }
    }